

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_handler.hpp
# Opt level: O2

void __thiscall
asio::detail::
binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>
::operator()(binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
             *this)

{
  BrokerBase *this_00;
  handle timeProtector;
  undefined1 local_d0 [26];
  byte local_b6;
  
  this_00 = (this->handler_).this;
  gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::lock
            (&timeProtector,(this->handler_).active);
  if ((timeProtector.data)->first == true) {
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)local_d0,operation_aborted);
    if (((this->arg1_)._M_cat == (error_category *)local_d0._8_8_) &&
       ((this->arg1_)._M_value == local_d0._0_4_)) {
      helics::ActionMessage::ActionMessage((ActionMessage *)local_d0,cmd_tick);
      local_b6 = local_b6 | 0x10;
      helics::BrokerBase::addActionMessage(this_00,(ActionMessage *)local_d0);
    }
    else {
      helics::ActionMessage::ActionMessage((ActionMessage *)local_d0,cmd_tick);
      helics::BrokerBase::addActionMessage(this_00,(ActionMessage *)local_d0);
    }
    helics::ActionMessage::~ActionMessage((ActionMessage *)local_d0);
  }
  (timeProtector.data)->second = false;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)&timeProtector.m_handle_lock);
  return;
}

Assistant:

void operator()()
  {
    static_cast<Handler&&>(handler_)(
        static_cast<const Arg1&>(arg1_));
  }